

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenCard.cpp
# Opt level: O2

void __thiscall GreenCard::GreenCard(GreenCard *this,string *n,int t)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)n);
  Card::Card(&this->super_Card,&sStack_48,t);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Card)._vptr_Card = (_func_int **)&PTR_effectBonus_00116168;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->type = t;
  this->tapped = false;
  return;
}

Assistant:

GreenCard::GreenCard(string n, int t) : Card{n, t}
{
    name = n;
    type = Type(t);

    tapped = false;
}